

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O2

CustomTabulated *
TasGrid::getShiftedExoticQuadrature
          (CustomTabulated *__return_storage_ptr__,int n,double shift,
          vector<double,_std::allocator<double>_> *shifted_weights,
          vector<double,_std::allocator<double>_> *ref_points,char *description,bool is_symmetric)

{
  pointer pcVar1;
  CustomTabulated *pCVar2;
  double *w;
  pointer pdVar3;
  _Alloc_hider _Var4;
  pointer *ppdVar5;
  size_type sVar6;
  long lVar7;
  ulong uVar8;
  size_t j;
  ulong uVar9;
  long lVar10;
  ulong in_XMM0_Qb;
  vector<int,_std::allocator<int>_> num_nodes;
  vector<double,_std::allocator<double>_> correction_points;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  points_cache;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  weights_cache;
  vector<int,_std::allocator<int>_> precision;
  allocator<char> local_f9;
  _Vector_base<double,_std::allocator<double>_> local_f8;
  string local_d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  double local_78;
  ulong uStack_70;
  CustomTabulated *local_60;
  char *local_58;
  ulong local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_78 = shift;
  if ((long)(shifted_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(shifted_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start !=
      (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    __assert_fail("shifted_weights.size() == ref_points.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0xed,
                  "TasGrid::CustomTabulated TasGrid::getShiftedExoticQuadrature(const int, const double, const std::vector<double> &, const std::vector<double> &, const char *, const bool)"
                 );
  }
  local_b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_70 = in_XMM0_Qb;
  local_60 = __return_storage_ptr__;
  local_58 = description;
  if (is_symmetric) {
    getGaussNodesAndWeights<true>(n,ref_points,shifted_weights,&local_b8,&local_98);
  }
  else {
    getGaussNodesAndWeights<false>(n,ref_points,shifted_weights,&local_b8,&local_98);
  }
  if ((local_78 != 0.0) || (NAN(local_78))) {
    local_78 = -local_78;
    uStack_70 = uStack_70 ^ 0x8000000000000000;
    uVar8 = 0;
    local_50 = 0;
    if (0 < n) {
      local_50 = (ulong)(uint)n;
    }
    for (; uVar8 != local_50; uVar8 = uVar8 + 1) {
      lVar10 = (long)local_b8.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      local_f8._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TasGrid::OneDimensionalNodes::getGaussLegendre
                ((int)lVar10,(vector *)&local_f8,(vector *)&local_d8);
      for (pdVar3 = local_f8._M_impl.super__Vector_impl_data._M_start;
          pdVar3 != local_f8._M_impl.super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
        *pdVar3 = *pdVar3 * local_78;
      }
      if (((byte)((local_d8._M_string_length - (long)local_d8._M_dataplus._M_p & 0xffffffff) >> 3) &
           0x1f & is_symmetric) != 0) {
        pcVar1 = local_d8._M_dataplus._M_p +
                 ((long)(local_d8._M_string_length - (long)local_d8._M_dataplus._M_p) >> 1) + -4;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      _Var4._M_p = local_d8._M_dataplus._M_p;
      sVar6 = local_d8._M_string_length;
      for (uVar9 = 0; uVar9 < (ulong)((long)(sVar6 - (long)_Var4._M_p) >> 3); uVar9 = uVar9 + 1) {
        for (lVar7 = 0; lVar10 != lVar7; lVar7 = lVar7 + 1) {
          if (ABS(*(double *)(_Var4._M_p + uVar9 * 8) -
                  local_b8.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7]) <= 1e-12) {
            pdVar3 = local_98.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar3[lVar7] = local_f8._M_impl.super__Vector_impl_data._M_start[uVar9] + pdVar3[lVar7]
            ;
            goto LAB_0013024f;
          }
        }
        std::vector<double,_std::allocator<double>_>::push_back
                  (local_b8.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar8,
                   (value_type_conflict1 *)(_Var4._M_p + uVar9 * 8));
        std::vector<double,_std::allocator<double>_>::push_back
                  (local_98.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar8,
                   local_f8._M_impl.super__Vector_impl_data._M_start + uVar9);
        _Var4._M_p = local_d8._M_dataplus._M_p;
        sVar6 = local_d8._M_string_length;
LAB_0013024f:
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_d8);
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_f8,(long)n,(allocator_type *)&local_d8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)n,(allocator_type *)&local_d8);
  uVar8 = 0;
  if (n < 1) {
    n = 0;
  }
  ppdVar5 = &((local_b8.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  for (; (uint)(n * 2) != uVar8; uVar8 = uVar8 + 2) {
    *(int *)((long)local_f8._M_impl.super__Vector_impl_data._M_start + uVar8 * 2) =
         (int)((ulong)((long)*ppdVar5 - (long)((_Vector_impl_data *)(ppdVar5 + -1))->_M_start) >> 3)
    ;
    *(int *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar8 * 2) = (int)uVar8 + 1;
    ppdVar5 = ppdVar5 + 3;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,local_58,&local_f9);
  pCVar2 = local_60;
  CustomTabulated::CustomTabulated
            (local_60,(vector<int,_std::allocator<int>_> *)&local_f8,
             (vector<int,_std::allocator<int>_> *)&local_48,&local_b8,&local_98,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_f8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_b8);
  return pCVar2;
}

Assistant:

inline TasGrid::CustomTabulated getShiftedExoticQuadrature(const int n, const double shift, const std::vector<double> &shifted_weights,
                                                           const std::vector<double> &ref_points, const char* description,
                                                           const bool is_symmetric = false) {
    // Create the set of points (roots) and weights for the first term.
    assert(shifted_weights.size() == ref_points.size());
    std::vector<std::vector<double>> points_cache, weights_cache;
    if (is_symmetric) {
        getGaussNodesAndWeights<true>(n, ref_points, shifted_weights, points_cache, weights_cache);
    } else {
        getGaussNodesAndWeights<false>(n, ref_points, shifted_weights, points_cache, weights_cache);
    }

    // Create and append the set of correction points and weights for the second term only if the shift is nonzero.
    if (shift != 0.0) {
        for (int i=0; i<n; i++) {
            const size_t init_size = points_cache[i].size();
            std::vector<double> correction_points, correction_weights;
            TasGrid::OneDimensionalNodes::getGaussLegendre(static_cast<int>(init_size), correction_weights, correction_points);
            for (auto &w : correction_weights) w *= -shift;
            if (correction_points.size() % 2 == 1 && is_symmetric) {
                // Zero out for stability.
                correction_points[(correction_points.size() - 1) / 2] = 0.0;
            }
            // Account for duplicates up to a certain tolerance.
            for (size_t j=0; j<correction_points.size(); j++) {
                long long nonunique_idx = -1;
                for (size_t k=0; k<init_size; k++) {
                    if (std::abs(correction_points[j] - points_cache[i][k]) <= Maths::num_tol) {
                        nonunique_idx = static_cast<long long>(k);
                        break;
                    }
                }
                if (nonunique_idx == -1) {
                    points_cache[i].push_back(correction_points[j]);
                    weights_cache[i].push_back(correction_weights[j]);
                } else {
                    weights_cache[i][nonunique_idx] += correction_weights[j];
                }
            }
        }
    }

    // Output to a CustomTabulated instance.
    std::vector<int> num_nodes(n), precision(n);
    for (int i=0; i<n; i++) {
        num_nodes[i] = static_cast<int>(points_cache[i].size());
        precision[i] = 2 * (i + 1) - 1;
    }
    return TasGrid::CustomTabulated(std::move(num_nodes), std::move(precision), std::move(points_cache), std::move(weights_cache),
                                    description);
}